

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf.c
# Opt level: O1

int read_AEDR(coda_cdf_product *product_file,int64_t offset,char *name,int32_t scope)

{
  coda_cdf_variable *type;
  undefined2 uVar1;
  char cVar2;
  undefined1 uVar3;
  uint uVar4;
  ushort uVar5;
  ushort uVar6;
  int iVar7;
  ushort uVar8;
  char *message;
  int32_t num_elems;
  int32_t num;
  int32_t record_type;
  int32_t data_type;
  int32_t attr_num;
  int64_t aedr_next;
  coda_dynamic_type *attribute;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 local_58;
  ushort local_54;
  ushort uStack_52;
  ushort local_50;
  ushort uStack_4e;
  ushort uStack_4c;
  ushort uStack_4a;
  coda_dynamic_type *local_48;
  long local_40;
  long local_38;
  
  if (offset == 0) {
    return 0;
  }
  iVar7 = read_bytes(product_file->raw_product,offset + 8,4,&local_5c);
  if (iVar7 < 0) {
    return -1;
  }
  uVar3 = (undefined1)local_5c;
  uVar5 = local_5c._1_2_ << 8;
  uVar6 = local_5c._1_2_ >> 8;
  local_5c = CONCAT13(uVar3,CONCAT21(uVar5 | uVar6,local_5c._3_1_));
  uVar4 = local_5c;
  if ((local_5c != 5) && (local_5c != 9)) {
    coda_set_error(-300,"CDF file has invalid record type (%d) for AEDR record",(ulong)local_5c);
    return -1;
  }
  iVar7 = read_bytes(product_file->raw_product,offset + 0xc,8,&local_50);
  if (iVar7 < 0) {
    return -1;
  }
  iVar7 = read_bytes(product_file->raw_product,offset + 0x14,4,&local_54);
  if (iVar7 < 0) {
    return -1;
  }
  iVar7 = read_bytes(product_file->raw_product,offset + 0x18,4,&local_58);
  if (iVar7 < 0) {
    return -1;
  }
  iVar7 = read_bytes(product_file->raw_product,offset + 0x1c,4,&local_60);
  if (iVar7 < 0) {
    return -1;
  }
  iVar7 = read_bytes(product_file->raw_product,offset + 0x20,4,&local_64);
  if (iVar7 < 0) {
    return -1;
  }
  uVar5 = local_50 << 8 | local_50 >> 8;
  local_50 = uStack_4a << 8 | uStack_4a >> 8;
  uVar8 = uStack_4e << 8 | uStack_4e >> 8;
  uStack_4e = uStack_4c << 8 | uStack_4c >> 8;
  uVar6 = local_54 << 8 | local_54 >> 8;
  _local_54 = CONCAT22(uVar6,uStack_52 << 8 | uStack_52 >> 8);
  local_58 = CONCAT22((ushort)local_58 << 8 | (ushort)local_58 >> 8,
                      local_58._2_2_ << 8 | local_58._2_2_ >> 8);
  uVar1 = CONCAT11((undefined1)local_60,local_60._1_1_);
  local_60 = CONCAT22(uVar1,CONCAT11(local_60._2_1_,local_60._3_1_));
  cVar2 = (char)local_64;
  uVar1 = CONCAT11((char)local_64,local_64._1_1_);
  local_64 = CONCAT22(uVar1,CONCAT11(local_64._2_1_,local_64._3_1_));
  local_40 = CONCAT26(uVar5,CONCAT24(uVar8,CONCAT22(uStack_4e,local_50)));
  uStack_4c = uVar8;
  uStack_4a = uVar5;
  if (((short)uVar5 < 0) || (product_file->file_size <= local_40)) {
    message = "CDF file has invalid offset for AEDR record";
  }
  else if ((short)uVar6 < 0) {
    message = "CDF file has invalid attribute number in AEDR record";
  }
  else {
    local_38 = (long)local_60;
    if (local_38 < 0) {
      message = "CDF file has invalid entry number in AEDR record";
    }
    else {
      if (-1 < cVar2) {
        if (local_58 != 0x20) {
          iVar7 = read_attribute(product_file,offset + 0x38,local_58,local_64,&local_48);
          if (iVar7 != 0) {
            return -1;
          }
          if ((scope & 1U) == 0 || uVar4 != 5) {
            if (product_file->root_type->num_fields <= local_38) {
              coda_set_error(-300,
                             "CDF Attribute entry number (%d) is outside range of available variables [0,%ld]"
                             ,local_38,product_file->root_type->num_fields + -1);
              return -1;
            }
            type = (coda_cdf_variable *)product_file->root_type->field_type[local_38];
            if (type->backend != coda_backend_cdf) {
              __assert_fail("((coda_cdf_variable *)product_file->root_type->field_type[num])->backend == coda_backend_cdf"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf.c"
                            ,0x1cb,
                            "int read_AEDR(coda_cdf_product *, int64_t, const char *, int32_t)");
            }
            iVar7 = coda_cdf_variable_add_attribute(type,name,local_48,1);
          }
          else {
            iVar7 = coda_mem_type_add_attribute
                              ((coda_mem_type *)product_file->root_type,name,local_48,1);
          }
          if (iVar7 != 0) {
            coda_dynamic_type_delete(local_48);
            return -1;
          }
          iVar7 = read_AEDR(product_file,local_40,name,scope);
          return -(uint)(iVar7 != 0);
        }
        message = "CDF EPOCH16 data type is not supported";
        iVar7 = -200;
        goto LAB_0012412a;
      }
      message = "CDF file has invalid number of entries in AEDR record";
    }
  }
  iVar7 = -300;
LAB_0012412a:
  coda_set_error(iVar7,message);
  return -1;
}

Assistant:

static int read_AEDR(coda_cdf_product *product_file, int64_t offset, const char *name, int32_t scope)
{
    coda_dynamic_type *attribute;
    int32_t record_type;
    int64_t aedr_next;
    int32_t attr_num;
    int32_t data_type;
    int32_t num;
    int32_t num_elems;

    if (offset == 0)
    {
        return 0;
    }

    if (read_bytes(product_file->raw_product, offset + 8, 4, &record_type) < 0)
    {
        return -1;
    }
#ifndef WORDS_BIGENDIAN
    swap_int32(&record_type);
#endif
    if (record_type != 5 && record_type != 9)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid record type (%d) for AEDR record", record_type);
        return -1;
    }

    if (read_bytes(product_file->raw_product, offset + 12, 8, &aedr_next) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 20, 4, &attr_num) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 24, 4, &data_type) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 28, 4, &num) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 32, 4, &num_elems) < 0)
    {
        return -1;
    }
#ifndef WORDS_BIGENDIAN
    swap_int64(&aedr_next);
    swap_int32(&attr_num);
    swap_int32(&data_type);
    swap_int32(&num);
    swap_int32(&num_elems);
#endif
    offset += 56;
    if (aedr_next < 0 || aedr_next >= product_file->file_size)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid offset for AEDR record");
        return -1;
    }
    if (attr_num < 0)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid attribute number in AEDR record");
        return -1;
    }
    if (num < 0)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid entry number in AEDR record");
        return -1;
    }
    if (num_elems < 0)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid number of entries in AEDR record");
        return -1;
    }

    if (data_type == 32)
    {
        coda_set_error(CODA_ERROR_UNSUPPORTED_PRODUCT, "CDF EPOCH16 data type is not supported");
        return -1;
    }

    if (read_attribute(product_file, offset, data_type, num_elems, &attribute) != 0)
    {
        return -1;
    }
    if (record_type == 5 && (scope & 1))
    {
        if (coda_mem_type_add_attribute((coda_mem_type *)product_file->root_type, name, attribute, 1) != 0)
        {
            coda_dynamic_type_delete(attribute);
            return -1;
        }
    }
    else
    {
        if (num < 0 || num >= product_file->root_type->num_fields)
        {
            coda_set_error(CODA_ERROR_PRODUCT,
                           "CDF Attribute entry number (%d) is outside range of available variables " "[0,%ld]", num,
                           product_file->root_type->num_fields - 1);
            return -1;
        }

        assert(((coda_cdf_variable *)product_file->root_type->field_type[num])->backend == coda_backend_cdf);
        if (coda_cdf_variable_add_attribute((coda_cdf_variable *)product_file->root_type->field_type[num], name,
                                            attribute, 1) != 0)
        {
            coda_dynamic_type_delete(attribute);
            return -1;
        }
    }

    if (read_AEDR(product_file, aedr_next, name, scope) != 0)
    {
        return -1;
    }

    return 0;
}